

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

int stream_less(void *lhsx,void *rhsx)

{
  bool bVar1;
  nghttp2_stream *rhs;
  nghttp2_stream *lhs;
  void *rhsx_local;
  void *lhsx_local;
  
  if (*(long *)((long)lhsx + 0x48) == *(long *)((long)rhsx + 0x48)) {
    bVar1 = *(ulong *)((long)lhsx + 0x58) < *(ulong *)((long)rhsx + 0x58);
  }
  else {
    bVar1 = (ulong)(*(long *)((long)rhsx + 0x48) - *(long *)((long)lhsx + 0x48)) < 0x100000000;
  }
  lhsx_local._4_4_ = (uint)bVar1;
  return lhsx_local._4_4_;
}

Assistant:

static int stream_less(const void *lhsx, const void *rhsx) {
  const nghttp2_stream *lhs, *rhs;

  lhs = nghttp2_struct_of(lhsx, nghttp2_stream, pq_entry);
  rhs = nghttp2_struct_of(rhsx, nghttp2_stream, pq_entry);

  if (lhs->cycle == rhs->cycle) {
    return lhs->seq < rhs->seq;
  }

  return rhs->cycle - lhs->cycle <= NGHTTP2_MAX_CYCLE_DISTANCE;
}